

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

_Bool ConnectionExists(SessionHandle *data,connectdata *needle,connectdata **usethis,
                      _Bool *force_reuse,_Bool *waitpipe)

{
  uint uVar1;
  ssl_connection_state sVar2;
  curl_llist *pcVar3;
  bool bVar4;
  _Bool _Var5;
  int iVar6;
  connectbundle *pcVar7;
  curl_llist_element *pcVar8;
  ulong uVar9;
  bool bVar10;
  Curl_handler *pCVar11;
  char *pcVar12;
  SessionHandle *handle;
  curl_llist_element *pcVar13;
  connectdata *conn;
  connectdata *local_68;
  ulong local_60;
  ulong local_50;
  
  _Var5 = IsPipeliningPossible(data,(connectdata *)(ulong)needle->handler->protocol);
  bVar10 = false;
  *force_reuse = false;
  *waitpipe = false;
  if (_Var5) {
    _Var5 = Curl_pipeline_site_blacklisted(data,needle);
    bVar10 = !_Var5;
  }
  pcVar7 = Curl_conncache_find_bundle(needle,(data->state).conn_cache);
  if (pcVar7 != (connectbundle *)0x0) {
    if ((pcVar7->multiuse == 2) || (data->multi == (Curl_multi *)0x0)) {
      local_60 = 0;
    }
    else {
      local_60 = data->multi->max_pipeline_length;
    }
    bVar4 = false;
    Curl_infof(data,"Found bundle for host %s: %p\n",(needle->host).name,pcVar7);
    if (bVar10) {
      bVar4 = true;
      if (pcVar7->multiuse < 1) {
        if ((pcVar7->multiuse == 0) && ((data->set).pipewait != false)) {
          Curl_infof(data,"Server doesn\'t support multi-use yet, wait\n");
          *waitpipe = true;
          return false;
        }
        bVar4 = false;
        Curl_infof(data,"Server doesn\'t support multi-use (yet)\n");
      }
    }
    pcVar13 = pcVar7->conn_list->head;
    local_50 = local_60;
    local_68 = (connectdata *)0x0;
LAB_0011c81c:
    do {
      if (pcVar13 == (curl_llist_element *)0x0) break;
      conn = (connectdata *)pcVar13->ptr;
      pcVar13 = pcVar13->next;
      _Var5 = disconnect_if_dead(conn,data);
      if (_Var5) {
LAB_0011cbd3:
        bVar10 = false;
      }
      else {
        pcVar3 = conn->recv_pipe;
        uVar9 = pcVar3->size + conn->send_pipe->size;
        if (!bVar4) {
          if (uVar9 != 0) goto LAB_0011cbd3;
          if ((conn->sock[0] != -1) && ((conn->bits).close != true)) goto LAB_0011c8e0;
          uVar9 = conn->connection_id;
          pcVar12 = "Connection #%ld isn\'t open enough, can\'t reuse\n";
LAB_0011c8ad:
          Curl_infof(data,pcVar12,uVar9);
          goto LAB_0011c81c;
        }
        if ((conn->bits).multiplex == false) {
          pcVar8 = conn->send_pipe->head;
          if (pcVar8 == (curl_llist_element *)0x0) {
            pcVar8 = pcVar3->head;
            if (pcVar8 != (curl_llist_element *)0x0) {
LAB_0011c8c1:
              handle = (SessionHandle *)pcVar8->ptr;
              goto LAB_0011c8c4;
            }
          }
          else {
            handle = (SessionHandle *)pcVar8->ptr;
            pcVar8 = pcVar3->head;
            if (pcVar8 == (curl_llist_element *)0x0) {
LAB_0011c8c4:
              if (handle == (SessionHandle *)0x0) goto LAB_0011c8e0;
            }
            else if (handle == (SessionHandle *)0x0) goto LAB_0011c8c1;
            _Var5 = IsPipeliningPossible(handle,(connectdata *)(ulong)conn->handler->protocol);
            if (!_Var5) goto LAB_0011cbd3;
          }
        }
LAB_0011c8e0:
        pCVar11 = needle->handler;
        uVar1 = pCVar11->flags;
        if ((((conn->handler->flags ^ uVar1) & 1) != 0) &&
           ((pCVar11->protocol & conn->handler->protocol) == 0)) goto LAB_0011cb7b;
        if ((uVar1 & 1) != 0) {
          if ((data->set).ssl.verifypeer == conn->verifypeer) {
            if ((data->set).ssl.verifyhost != conn->verifyhost) goto LAB_0011cb7b;
            goto LAB_0011c940;
          }
          bVar10 = false;
          goto LAB_0011cbd5;
        }
LAB_0011c940:
        if (((needle->bits).proxy == (conn->bits).proxy) && ((bVar4 || (conn->inuse == false)))) {
          pcVar12 = needle->localdev;
          if ((pcVar12 == (char *)0x0 && needle->localport == 0) ||
             ((((conn->localport == needle->localport &&
                (conn->localportrange == needle->localportrange)) && (pcVar12 != (char *)0x0)) &&
              ((conn->localdev != (char *)0x0 &&
               (iVar6 = strcmp(conn->localdev,pcVar12), iVar6 == 0)))))) {
            if (-1 < (char)uVar1) {
              iVar6 = curl_strequal(needle->user,conn->user);
              if ((iVar6 == 0) || (iVar6 = curl_strequal(needle->passwd,conn->passwd), iVar6 == 0))
              goto LAB_0011cbd3;
              pCVar11 = needle->handler;
            }
            if (((needle->bits).httpproxy == true) && ((pCVar11->flags & 1) == 0)) {
              if ((((conn->bits).httpproxy == true) &&
                  ((((needle->bits).tunnel_proxy == true && ((conn->bits).tunnel_proxy == true)) &&
                   (iVar6 = Curl_raw_equal((needle->proxy).name,(conn->proxy).name), iVar6 != 0))))
                 && (needle->port == conn->port)) {
                pCVar11 = needle->handler;
                goto LAB_0011ca84;
              }
              if ((((conn->bits).proxy != true) || (needle->proxytype != conn->proxytype)) ||
                 (((needle->bits).tunnel_proxy != (conn->bits).tunnel_proxy ||
                  ((iVar6 = Curl_raw_equal((needle->proxy).name,(conn->proxy).name), iVar6 == 0 ||
                   (needle->port != conn->port)))))) goto LAB_0011c81c;
LAB_0011caf5:
              if (!(bool)(bVar4 & uVar9 != 0)) goto LAB_0011cc51;
            }
            else {
LAB_0011ca84:
              iVar6 = Curl_raw_equal(pCVar11->scheme,conn->handler->scheme);
              if (((iVar6 == 0) && ((needle->handler->protocol & conn->handler->protocol) == 0)) ||
                 ((iVar6 = Curl_raw_equal((needle->host).name,(conn->host).name), iVar6 == 0 ||
                  (needle->remote_port != conn->remote_port)))) goto LAB_0011c81c;
              if ((needle->handler->flags & 1) == 0) goto LAB_0011caf5;
              _Var5 = Curl_ssl_config_matches(&needle->ssl_config,&conn->ssl_config);
              if (!_Var5) goto LAB_0011cbd3;
              sVar2 = conn->ssl[0].state;
              bVar10 = sVar2 == ssl_connection_complete;
              if (!(bool)(bVar4 & bVar10)) {
                if (sVar2 == ssl_connection_complete) {
                  local_68 = conn;
                }
                goto LAB_0011cbd5;
              }
              if (uVar9 == 0) goto LAB_0011cc51;
            }
            if (local_60 - 1 < uVar9) {
              pcVar12 = "Pipe is full, skip (%zu)\n";
              goto LAB_0011c8ad;
            }
            _Var5 = Curl_pipeline_penalized(data,conn);
            if (_Var5) {
              Curl_infof(data,"Penalized, skip\n");
            }
            else {
              if (local_60 == 0) {
                Curl_infof(data,"Multiplexed connection found!\n");
                goto LAB_0011cc51;
              }
              if (uVar9 < local_50) {
                bVar10 = false;
                local_68 = conn;
                local_50 = uVar9;
                goto LAB_0011cbd5;
              }
            }
            goto LAB_0011c81c;
          }
        }
LAB_0011cb7b:
        bVar10 = false;
      }
LAB_0011cbd5:
    } while (!bVar10);
    conn = local_68;
    if (local_68 != (connectdata *)0x0) {
LAB_0011cc51:
      *usethis = conn;
      return true;
    }
  }
  return false;
}

Assistant:

static bool
ConnectionExists(struct SessionHandle *data,
                 struct connectdata *needle,
                 struct connectdata **usethis,
                 bool *force_reuse,
                 bool *waitpipe)
{
  struct connectdata *check;
  struct connectdata *chosen = 0;
  bool canPipeline = IsPipeliningPossible(data, needle);
#ifdef USE_NTLM
  bool wantNTLMhttp = ((data->state.authhost.want & CURLAUTH_NTLM) ||
                       (data->state.authhost.want & CURLAUTH_NTLM_WB)) &&
    (needle->handler->protocol & PROTO_FAMILY_HTTP) ? TRUE : FALSE;
#endif
  struct connectbundle *bundle;

  *force_reuse = FALSE;
  *waitpipe = FALSE;

  /* We can't pipe if the site is blacklisted */
  if(canPipeline && Curl_pipeline_site_blacklisted(data, needle)) {
    canPipeline = FALSE;
  }

  /* Look up the bundle with all the connections to this
     particular host */
  bundle = Curl_conncache_find_bundle(needle, data->state.conn_cache);
  if(bundle) {
    /* Max pipe length is zero (unlimited) for multiplexed connections */
    size_t max_pipe_len = (bundle->multiuse != BUNDLE_MULTIPLEX)?
      max_pipeline_length(data->multi):0;
    size_t best_pipe_len = max_pipe_len;
    struct curl_llist_element *curr;

    infof(data, "Found bundle for host %s: %p\n",
          needle->host.name, (void *)bundle);

    /* We can't pipe if we don't know anything about the server */
    if(canPipeline) {
      if(bundle->multiuse <= BUNDLE_UNKNOWN) {
        if((bundle->multiuse == BUNDLE_UNKNOWN) && data->set.pipewait) {
          infof(data, "Server doesn't support multi-use yet, wait\n");
          *waitpipe = TRUE;
          return FALSE; /* no re-use */
        }

        infof(data, "Server doesn't support multi-use (yet)\n");
        canPipeline = FALSE;
      }
    }

    curr = bundle->conn_list->head;
    while(curr) {
      bool match = FALSE;
#if defined(USE_NTLM)
      bool credentialsMatch = FALSE;
#endif
      size_t pipeLen;

      /*
       * Note that if we use a HTTP proxy, we check connections to that
       * proxy and not to the actual remote server.
       */
      check = curr->ptr;
      curr = curr->next;

      if(disconnect_if_dead(check, data))
        continue;

      pipeLen = check->send_pipe->size + check->recv_pipe->size;

      if(canPipeline) {

        if(!check->bits.multiplex) {
          /* If not multiplexing, make sure the pipe has only GET requests */
          struct SessionHandle* sh = gethandleathead(check->send_pipe);
          struct SessionHandle* rh = gethandleathead(check->recv_pipe);
          if(sh) {
            if(!IsPipeliningPossible(sh, check))
              continue;
          }
          else if(rh) {
            if(!IsPipeliningPossible(rh, check))
              continue;
          }
        }
      }
      else {
        if(pipeLen > 0) {
          /* can only happen within multi handles, and means that another easy
             handle is using this connection */
          continue;
        }

        if(Curl_resolver_asynch()) {
          /* ip_addr_str[0] is NUL only if the resolving of the name hasn't
             completed yet and until then we don't re-use this connection */
          if(!check->ip_addr_str[0]) {
            infof(data,
                  "Connection #%ld is still name resolving, can't reuse\n",
                  check->connection_id);
            continue;
          }
        }

        if((check->sock[FIRSTSOCKET] == CURL_SOCKET_BAD) ||
           check->bits.close) {
          /* Don't pick a connection that hasn't connected yet or that is going
             to get closed. */
          infof(data, "Connection #%ld isn't open enough, can't reuse\n",
                check->connection_id);
#ifdef DEBUGBUILD
          if(check->recv_pipe->size > 0) {
            infof(data,
                  "BAD! Unconnected #%ld has a non-empty recv pipeline!\n",
                  check->connection_id);
          }
#endif
          continue;
        }
      }

      if((needle->handler->flags&PROTOPT_SSL) !=
         (check->handler->flags&PROTOPT_SSL))
        /* don't do mixed SSL and non-SSL connections */
        if(!(needle->handler->protocol & check->handler->protocol))
          /* except protocols that have been upgraded via TLS */
          continue;

      if(needle->handler->flags&PROTOPT_SSL) {
        if((data->set.ssl.verifypeer != check->verifypeer) ||
           (data->set.ssl.verifyhost != check->verifyhost))
          continue;
      }

      if(needle->bits.proxy != check->bits.proxy)
        /* don't do mixed proxy and non-proxy connections */
        continue;

      if(!canPipeline && check->inuse)
        /* this request can't be pipelined but the checked connection is
           already in use so we skip it */
        continue;

      if(needle->localdev || needle->localport) {
        /* If we are bound to a specific local end (IP+port), we must not
           re-use a random other one, although if we didn't ask for a
           particular one we can reuse one that was bound.

           This comparison is a bit rough and too strict. Since the input
           parameters can be specified in numerous ways and still end up the
           same it would take a lot of processing to make it really accurate.
           Instead, this matching will assume that re-uses of bound connections
           will most likely also re-use the exact same binding parameters and
           missing out a few edge cases shouldn't hurt anyone very much.
        */
        if((check->localport != needle->localport) ||
           (check->localportrange != needle->localportrange) ||
           !check->localdev ||
           !needle->localdev ||
           strcmp(check->localdev, needle->localdev))
          continue;
      }

      if((!(needle->handler->flags & PROTOPT_CREDSPERREQUEST))
#ifdef USE_NTLM
         || (wantNTLMhttp || check->ntlm.state != NTLMSTATE_NONE)
#endif
        ) {
        /* This protocol requires credentials per connection or is HTTP+NTLM,
           so verify that we're using the same name and password as well */
        if(!strequal(needle->user, check->user) ||
           !strequal(needle->passwd, check->passwd)) {
          /* one of them was different */
          continue;
        }
#if defined(USE_NTLM)
        credentialsMatch = TRUE;
#endif
      }

      if(!needle->bits.httpproxy || needle->handler->flags&PROTOPT_SSL ||
         (needle->bits.httpproxy && check->bits.httpproxy &&
          needle->bits.tunnel_proxy && check->bits.tunnel_proxy &&
          Curl_raw_equal(needle->proxy.name, check->proxy.name) &&
          (needle->port == check->port))) {
        /* The requested connection does not use a HTTP proxy or it uses SSL or
           it is a non-SSL protocol tunneled over the same http proxy name and
           port number or it is a non-SSL protocol which is allowed to be
           upgraded via TLS */

        if((Curl_raw_equal(needle->handler->scheme, check->handler->scheme) ||
            needle->handler->protocol & check->handler->protocol) &&
           Curl_raw_equal(needle->host.name, check->host.name) &&
           needle->remote_port == check->remote_port) {
          if(needle->handler->flags & PROTOPT_SSL) {
            /* This is a SSL connection so verify that we're using the same
               SSL options as well */
            if(!Curl_ssl_config_matches(&needle->ssl_config,
                                        &check->ssl_config)) {
              DEBUGF(infof(data,
                           "Connection #%ld has different SSL parameters, "
                           "can't reuse\n",
                           check->connection_id));
              continue;
            }
            else if(check->ssl[FIRSTSOCKET].state != ssl_connection_complete) {
              DEBUGF(infof(data,
                           "Connection #%ld has not started SSL connect, "
                           "can't reuse\n",
                           check->connection_id));
              continue;
            }
          }
          match = TRUE;
        }
      }
      else { /* The requested needle connection is using a proxy,
                is the checked one using the same host, port and type? */
        if(check->bits.proxy &&
           (needle->proxytype == check->proxytype) &&
           (needle->bits.tunnel_proxy == check->bits.tunnel_proxy) &&
           Curl_raw_equal(needle->proxy.name, check->proxy.name) &&
           needle->port == check->port) {
          /* This is the same proxy connection, use it! */
          match = TRUE;
        }
      }

      if(match) {
#if defined(USE_NTLM)
        /* If we are looking for an HTTP+NTLM connection, check if this is
           already authenticating with the right credentials. If not, keep
           looking so that we can reuse NTLM connections if
           possible. (Especially we must not reuse the same connection if
           partway through a handshake!) */
        if(wantNTLMhttp) {
          if(credentialsMatch && check->ntlm.state != NTLMSTATE_NONE) {
            chosen = check;

            /* We must use this connection, no other */
            *force_reuse = TRUE;
            break;
          }
          else if(credentialsMatch)
            /* this is a backup choice */
            chosen = check;
          continue;
        }
#endif

        if(canPipeline) {
          /* We can pipeline if we want to. Let's continue looking for
             the optimal connection to use, i.e the shortest pipe that is not
             blacklisted. */

          if(pipeLen == 0) {
            /* We have the optimal connection. Let's stop looking. */
            chosen = check;
            break;
          }

          /* We can't use the connection if the pipe is full */
          if(max_pipe_len && (pipeLen >= max_pipe_len)) {
            infof(data, "Pipe is full, skip (%zu)\n", pipeLen);
            continue;
          }
#ifdef USE_NGHTTP2
          /* If multiplexed, make sure we don't go over concurrency limit */
          if(check->bits.multiplex) {
            /* Multiplexed connections can only be HTTP/2 for now */
            struct http_conn *httpc = &check->proto.httpc;
            if(pipeLen >= httpc->settings.max_concurrent_streams) {
              infof(data, "MAX_CONCURRENT_STREAMS reached, skip (%zu)\n",
                    pipeLen);
              continue;
            }
          }
#endif
          /* We can't use the connection if the pipe is penalized */
          if(Curl_pipeline_penalized(data, check)) {
            infof(data, "Penalized, skip\n");
            continue;
          }

          if(max_pipe_len) {
            if(pipeLen < best_pipe_len) {
              /* This connection has a shorter pipe so far. We'll pick this
                 and continue searching */
              chosen = check;
              best_pipe_len = pipeLen;
              continue;
            }
          }
          else {
            /* When not pipelining (== multiplexed), we have a match here! */
            chosen = check;
            infof(data, "Multiplexed connection found!\n");
            break;
          }
        }
        else {
          /* We have found a connection. Let's stop searching. */
          chosen = check;
          break;
        }
      }
    }
  }

  if(chosen) {
    *usethis = chosen;
    return TRUE; /* yes, we found one to use! */
  }

  return FALSE; /* no matching connecting exists */
}